

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPTP.cpp
# Opt level: O2

TermList __thiscall Parse::TPTP::createTypeConApplication(TPTP *this,string *name,uint arity)

{
  Value VVar1;
  TermList t;
  uint typeCon;
  TermList TVar2;
  TermList TVar3;
  AtomicSort *pAVar4;
  UserErrorException *pUVar5;
  TermList *pTVar6;
  bool added;
  StlIter __begin1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  RangeIterator<unsigned_int> local_40;
  
  added = false;
  typeCon = Kernel::Signature::addTypeCon(DAT_00a14190,name,arity,&added);
  if (added == true) {
    pUVar5 = (UserErrorException *)__cxa_allocate_exception(0x50);
    std::__cxx11::string::string((string *)&local_60,(string *)name);
    Lib::UserErrorException::
    Exception<char_const*,std::__cxx11::string,Lib::UserErrorException::Exception,unsigned_int>
              (pUVar5,"Undeclared type constructor ",&local_60,"/",arity);
    __cxa_throw(pUVar5,&Lib::UserErrorException::typeinfo,
                Lib::UserErrorException::~UserErrorException);
  }
  if (arity == 0) {
    pTVar6 = (TermList *)0x0;
  }
  else {
    pTVar6 = (this->_termLists)._stack;
    pTVar6 = pTVar6 + (((ulong)((long)(this->_termLists)._cursor - (long)pTVar6) >> 3) -
                      (ulong)arity);
  }
  local_40._next = 0;
  local_40._from = 0;
  local_40._to = arity;
  Lib::IterTraits<Lib::RangeIterator<unsigned_int>_>::StlIter::StlIter
            (&__begin1,(IterTraits<Lib::RangeIterator<unsigned_int>_> *)&local_40);
  while( true ) {
    if ((__begin1._cur.super_OptionBase<unsigned_int>._isSome & 1U) == 0) {
      pAVar4 = Kernel::AtomicSort::create(typeCon,arity,pTVar6);
      Lib::Stack<Kernel::TermList>::pop(&this->_termLists,arity);
      return (TermList)(uint64_t)pAVar4;
    }
    t._content = pTVar6[(uint)__begin1._cur.super_OptionBase<unsigned_int>._elem._elem]._content;
    TVar2 = sortOf(this,t);
    TVar3 = Kernel::AtomicSort::superSort();
    if (TVar2._content != TVar3._content) break;
    VVar1 = *(Value *)__begin1._iter.
                      super_OptionBase<Lib::IterTraits<Lib::RangeIterator<unsigned_int>_>_&>.
                      super_OptionBaseRef<Lib::IterTraits<Lib::RangeIterator<unsigned_int>_>_*>.
                      _elem;
    __begin1._cur.super_OptionBase<unsigned_int>._isSome =
         VVar1.init <
         *(uint *)((long)__begin1._iter.
                         super_OptionBase<Lib::IterTraits<Lib::RangeIterator<unsigned_int>_>_&>.
                         super_OptionBaseRef<Lib::IterTraits<Lib::RangeIterator<unsigned_int>_>_*>.
                         _elem + 8);
    if (__begin1._cur.super_OptionBase<unsigned_int>._isSome) {
      *(uint *)__begin1._iter.super_OptionBase<Lib::IterTraits<Lib::RangeIterator<unsigned_int>_>_&>
               .super_OptionBaseRef<Lib::IterTraits<Lib::RangeIterator<unsigned_int>_>_*>._elem =
           VVar1.init + 1;
      __begin1._cur.super_OptionBase<unsigned_int>._elem._elem = VVar1;
    }
  }
  pUVar5 = (UserErrorException *)__cxa_allocate_exception(0x50);
  Lib::UserErrorException::
  Exception<char_const*,Kernel::TermList,Lib::UserErrorException::Exception,char_const*,Lib::UserErrorException::Exception>
            (pUVar5,"The sort ",TVar2," of type argument ",t," is not $tType as mandated by TF1");
  __cxa_throw(pUVar5,&Lib::UserErrorException::typeinfo,Lib::UserErrorException::~UserErrorException
             );
}

Assistant:

TermList TPTP::createTypeConApplication(std::string name, unsigned arity)
{ 
  ASS_GE(_termLists.size(), arity);

  bool added = false;
  unsigned typeCon = env.signature->addTypeCon(name,arity,added);
  if(added)
    USER_ERROR("Undeclared type constructor ", name, "/", arity);

  auto args = nLastTermLists(arity);
  for (auto i : range(0, arity)) {
    auto term = args[i];
    auto sort = sortOf(term);
    if (sort != AtomicSort::superSort()) 
        USER_ERROR("The sort ", sort, " of type argument ", term, " is not $tType as mandated by TF1");
  }
  auto s = TermList(AtomicSort::create(typeCon, arity, args));
  _termLists.pop(arity);
  return s;
}